

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O2

bool __thiscall
V4L2Device::compress_jpeg(V4L2Device *this,RawImagePtr *image,string *jpeg_file_name)

{
  uint uVar1;
  RawImage *pRVar2;
  Options *pOVar3;
  int iVar4;
  FILE *__stream;
  OptionDetails *this_00;
  int *piVar5;
  Writer *pWVar6;
  char *local_3a0;
  JSAMPROW row_pointer [1];
  Writer local_390;
  undefined8 local_320 [6];
  undefined8 local_2f0;
  undefined8 local_2e8;
  uint local_1cc;
  jpeg_error_mgr jerr;
  
  local_320[0] = jpeg_std_error(&jerr);
  jpeg_CreateCompress(local_320,0x50,0x248);
  __stream = fopen((jpeg_file_name->_M_dataplus)._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    local_390._vptr_Writer = (_func_int **)&PTR__Writer_00176078;
    local_390.m_level = Error;
    local_390.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_390.m_line = 0x239;
    local_390.m_func = "bool V4L2Device::compress_jpeg(const RawImagePtr &, const std::string &)";
    local_390.m_verboseLevel = 0;
    local_390.m_logger = (Logger *)0x0;
    local_390.m_proceed = false;
    local_390.m_messageBuilder.m_logger = (Logger *)0x0;
    local_390.m_messageBuilder.m_containerLogSeperator = "";
    local_390.m_dispatchAction = NormalLog;
    local_390.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_390.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_390.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar6 = el::base::Writer::construct(&local_390,1,"default");
    pWVar6 = el::base::Writer::operator<<(pWVar6,(char (*) [13])"can\'t open \'");
    pWVar6 = el::base::Writer::operator<<(pWVar6,jpeg_file_name);
    pWVar6 = el::base::Writer::operator<<(pWVar6,(char (*) [4])"\': ");
    piVar5 = __errno_location();
    local_3a0 = strerror(*piVar5);
    el::base::Writer::operator<<(pWVar6,&local_3a0);
    el::base::Writer::~Writer(&local_390);
  }
  else {
    jpeg_stdio_dest(local_320,__stream);
    pRVar2 = (image->_M_t).
             super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
             ._M_t.
             super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>
             .super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl;
    local_2f0._0_4_ = pRVar2->width;
    local_2f0._4_4_ = pRVar2->height;
    local_2e8 = 0x200000003;
    jpeg_set_defaults(local_320);
    pOVar3 = (this->options).super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string((string *)&local_390,"quality",(allocator *)&local_3a0);
    iVar4 = cxxopts::Options::count(pOVar3,(string *)&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    if (iVar4 == 0) {
      iVar4 = 0x4b;
    }
    else {
      pOVar3 = (this->options).super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      std::__cxx11::string::string((string *)&local_390,"quality",(allocator *)&local_3a0);
      this_00 = cxxopts::Options::operator[](pOVar3,(string *)&local_390);
      piVar5 = cxxopts::OptionDetails::as<int>(this_00);
      iVar4 = *piVar5;
      std::__cxx11::string::~string((string *)&local_390);
    }
    jpeg_set_quality(local_320,iVar4,1);
    jpeg_start_compress(local_320,1);
    uVar1 = ((image->_M_t).
             super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
             ._M_t.
             super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>
             .super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl)->width;
    while (local_1cc < local_2f0._4_4_) {
      row_pointer[0] =
           (JSAMPROW)
           ((ulong)(local_1cc * uVar1 * 3) +
           (long)(((image->_M_t).
                   super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>
                   .super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl)->raw_data).
                 _M_t);
      jpeg_write_scanlines(local_320,row_pointer,1);
    }
    jpeg_finish_compress(local_320);
    fclose(__stream);
    jpeg_destroy_compress(local_320);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool
    compress_jpeg(const RawImagePtr& image, const std::string& jpeg_file_name)
    {
        struct jpeg_compress_struct cinfo;
        struct jpeg_error_mgr jerr;

        JSAMPROW row_pointer[1];

        cinfo.err = jpeg_std_error(&jerr);
        jpeg_create_compress(&cinfo);

        FILE* outfile = fopen(jpeg_file_name.c_str(), "wb");
        if (outfile == nullptr) {
            LOG(ERROR) << "can't open '" << jpeg_file_name << "': " << strerror(errno);
            return false;
        }

        jpeg_stdio_dest(&cinfo, outfile);

        cinfo.image_width = image->width; /* image width and height, in pixels */
        cinfo.image_height = image->height;
        cinfo.input_components = 3; /* # of color components per pixel */
        cinfo.in_color_space = JCS_RGB; /* colorspace of input image */

        jpeg_set_defaults(&cinfo);

        int quality = kDefaultJPEGQuality;
        if (options->count("quality")) {
            quality = (*options)["quality"].as<int>();
        }

        jpeg_set_quality(&cinfo, quality, TRUE /* limit to baseline-JPEG values */);
        jpeg_start_compress(&cinfo, TRUE);

        auto row_stride = image->width * 3; /* JSAMPLEs per row in image_buffer */
        while (cinfo.next_scanline < cinfo.image_height) {
            row_pointer[0] = &(image->raw_data.get()[cinfo.next_scanline * row_stride]);
            jpeg_write_scanlines(&cinfo, row_pointer, 1);
        }

        jpeg_finish_compress(&cinfo);
        fclose(outfile);
        jpeg_destroy_compress(&cinfo);

        return true;
    }